

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

ZSTD_bounds ZSTD_dParam_getBounds(ZSTD_dParameter dParam)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  
  switch(dParam) {
  case ZSTD_d_experimentalParam1:
  case ZSTD_d_experimentalParam2:
  case ZSTD_d_experimentalParam3:
  case ZSTD_d_experimentalParam4:
    uVar2 = 0x100000000;
    break;
  default:
    if (dParam != ZSTD_d_windowLogMax) {
      return (ZSTD_bounds)ZEXT816(0xffffffffffffffd8);
    }
    uVar2 = 0x1f0000000a;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  return (ZSTD_bounds)(auVar1 << 0x40);
}

Assistant:

ZSTD_bounds ZSTD_dParam_getBounds(ZSTD_dParameter dParam)
{
    ZSTD_bounds bounds = { 0, 0, 0 };
    switch(dParam) {
        case ZSTD_d_windowLogMax:
            bounds.lowerBound = ZSTD_WINDOWLOG_ABSOLUTEMIN;
            bounds.upperBound = ZSTD_WINDOWLOG_MAX;
            return bounds;
        case ZSTD_d_format:
            bounds.lowerBound = (int)ZSTD_f_zstd1;
            bounds.upperBound = (int)ZSTD_f_zstd1_magicless;
            ZSTD_STATIC_ASSERT(ZSTD_f_zstd1 < ZSTD_f_zstd1_magicless);
            return bounds;
        case ZSTD_d_stableOutBuffer:
            bounds.lowerBound = (int)ZSTD_bm_buffered;
            bounds.upperBound = (int)ZSTD_bm_stable;
            return bounds;
        case ZSTD_d_forceIgnoreChecksum:
            bounds.lowerBound = (int)ZSTD_d_validateChecksum;
            bounds.upperBound = (int)ZSTD_d_ignoreChecksum;
            return bounds;
        case ZSTD_d_refMultipleDDicts:
            bounds.lowerBound = (int)ZSTD_rmd_refSingleDDict;
            bounds.upperBound = (int)ZSTD_rmd_refMultipleDDicts;
            return bounds;
        default:;
    }
    bounds.error = ERROR(parameter_unsupported);
    return bounds;
}